

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void acquireMonitor(_GLFWwindow *window)

{
  _GLFWwindow *in_RDI;
  GLFWvidmode mode;
  int ypos;
  int xpos;
  GLFWvidmode *in_stack_00000058;
  _GLFWmonitor *in_stack_00000060;
  undefined4 local_28;
  undefined4 local_24;
  int *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (_glfw.x11.saver.count == 0) {
    XGetScreenSaver(_glfw.x11.display,0x62a1dc,0x62a1e0,0x62a1e4,0x62a1e8);
    XSetScreenSaver(_glfw.x11.display,0,0,0,2);
  }
  if (in_RDI->monitor->window == (_GLFWwindow *)0x0) {
    _glfw.x11.saver.count = _glfw.x11.saver.count + 1;
  }
  _glfwSetVideoModeX11(in_stack_00000060,in_stack_00000058);
  if ((in_RDI->x11).overrideRedirect != 0) {
    _glfwPlatformGetMonitorPos
              ((_GLFWmonitor *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    _glfwPlatformGetVideoMode((_GLFWmonitor *)mode._16_8_,(GLFWvidmode *)mode._8_8_);
    XMoveResizeWindow(_glfw.x11.display,(in_RDI->x11).handle,in_stack_fffffffffffffff4,
                      in_stack_fffffffffffffff0,local_28,local_24);
  }
  _glfwInputMonitorWindow(in_RDI->monitor,in_RDI);
  return;
}

Assistant:

static void acquireMonitor(_GLFWwindow* window)
{
    if (_glfw.x11.saver.count == 0)
    {
        // Remember old screen saver settings
        XGetScreenSaver(_glfw.x11.display,
                        &_glfw.x11.saver.timeout,
                        &_glfw.x11.saver.interval,
                        &_glfw.x11.saver.blanking,
                        &_glfw.x11.saver.exposure);

        // Disable screen saver
        XSetScreenSaver(_glfw.x11.display, 0, 0, DontPreferBlanking,
                        DefaultExposures);
    }

    if (!window->monitor->window)
        _glfw.x11.saver.count++;

    _glfwSetVideoModeX11(window->monitor, &window->videoMode);

    if (window->x11.overrideRedirect)
    {
        int xpos, ypos;
        GLFWvidmode mode;

        // Manually position the window over its monitor
        _glfwPlatformGetMonitorPos(window->monitor, &xpos, &ypos);
        _glfwPlatformGetVideoMode(window->monitor, &mode);

        XMoveResizeWindow(_glfw.x11.display, window->x11.handle,
                          xpos, ypos, mode.width, mode.height);
    }

    _glfwInputMonitorWindow(window->monitor, window);
}